

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

string * __thiscall
glcts::generateBasicFragmentSrc_abi_cxx11_
          (string *__return_storage_ptr__,glcts *this,GLSLVersion glslVersion)

{
  char *pcVar1;
  ostream *poVar2;
  stringstream str;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  pcVar1 = glu::getGLSLVersionDeclaration((GLSLVersion)this);
  poVar2 = std::operator<<(&local_190,pcVar1);
  std::operator<<(poVar2,"\n");
  std::operator<<(&local_190,
                  "uniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n   o_color = u_color;\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateBasicFragmentSrc(glu::GLSLVersion glslVersion)
{
	std::stringstream str;

	str << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
	str << "uniform highp vec4 u_color;\n"
		   "layout(location = 0) out mediump vec4 o_color;\n"
		   "void main (void)\n"
		   "{\n"
		   "   o_color = u_color;\n"
		   "}\n";

	return str.str();
}